

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall QWidgetTextControlPrivate::indent(QWidgetTextControlPrivate *this)

{
  int iVar1;
  int iVar2;
  QTextBlock *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  pQVar3 = (QTextBlock *)QTextCursor::currentList();
  iVar2 = (int)&local_68;
  if (pQVar3 == (QTextBlock *)0x0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_68);
    iVar1 = QTextFormat::intProperty((int)&local_58);
    ::QVariant::QVariant(&local_48,iVar1 + 1);
    QTextFormat::setProperty(iVar2,(QVariant *)0x1040);
    ::QVariant::~QVariant(&local_48);
    QTextCursor::mergeBlockFormat((QTextBlockFormat *)&this->cursor);
  }
  else {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextList::format((QTextList *)&local_68);
    iVar1 = QTextFormat::intProperty(iVar2);
    ::QVariant::QVariant(&local_48,iVar1 + 1);
    QTextFormat::setProperty(iVar2,(QVariant *)0x3001);
    ::QVariant::~QVariant(&local_48);
    QTextCursor::block();
    iVar2 = QTextList::itemNumber(pQVar3);
    if (iVar2 == 1) {
      QTextObject::setFormat((QTextFormat *)pQVar3);
    }
    else {
      QTextCursor::createList((QTextListFormat *)&this->cursor);
    }
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::indent()
{
    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextList *list = cursor.currentList();
    if (!list) {
        QTextBlockFormat modifier;
        modifier.setIndent(blockFmt.indent() + 1);
        cursor.mergeBlockFormat(modifier);
    } else {
        QTextListFormat format = list->format();
        format.setIndent(format.indent() + 1);

        if (list->itemNumber(cursor.block()) == 1)
            list->setFormat(format);
        else
            cursor.createList(format);
    }
}